

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          LogicalType params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2_00;
  LogicalType params_3_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  LogicalType local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff18;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&local_b0,(string *)msg);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff30,(string *)params);
  LogicalType::LogicalType(&local_120,(LogicalType *)params_1);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff10,(string *)params_2);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffef8,(LogicalType *)params_3);
  ::std::__cxx11::string::string(local_50,(string *)params_4._0_8_);
  ::std::__cxx11::string::string
            (local_70,(string *)
                      params_4.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  ::std::__cxx11::string::string
            (local_90,(string *)
                      params_4.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  params_2_00._M_string_length = (size_type)local_50;
  params_2_00._M_dataplus._M_p = (pointer)&stack0xfffffffffffffef8;
  params_2_00.field_2._M_allocated_capacity = (size_type)local_70;
  params_2_00.field_2._8_8_ = local_90;
  params_3_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       values.
       super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
       ._M_impl.super__Vector_impl_data._M_start;
  params_3_00.id_ = 0x55;
  params_3_00.physical_type_ = 0x8b;
  params_3_00._2_6_ = 399;
  params_3_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       values.
       super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  params_4_00._8_24_ = local_120;
  params_4_00._M_dataplus._M_p =
       (pointer)values.
                super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,(string *)&values,&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,
             (LogicalType *)&stack0xffffffffffffff10,params_2_00,params_3_00,params_4_00,
             in_stack_fffffffffffffef8,in_stack_ffffffffffffff18);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string(local_50);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffef8);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  LogicalType::~LogicalType(&local_120);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(&values);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}